

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O3

void Map_NodeTryDroppingOnePhase(Map_Man_t *p,Map_Node_t *pNode)

{
  float *pfVar1;
  Map_Cut_t *pCut;
  Map_SuperLib_t *pMVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Map_Cut_t *pMVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar14;
  
  pMVar5 = pNode->pCutBest[0];
  if (pMVar5 == (Map_Cut_t *)0x0) {
    return;
  }
  pCut = pNode->pCutBest[1];
  if (pCut == (Map_Cut_t *)0x0) {
    return;
  }
  iVar4 = p->fMappingMode;
  if (iVar4 == 1) {
    return;
  }
  pMVar2 = p->pSuperLib;
  fVar10 = (pMVar2->tDelayInv).Rise;
  fVar13 = (pMVar2->tDelayInv).Fall;
  auVar11._0_4_ = fVar10 + pCut->M[1].tArrive.Fall;
  auVar11._4_4_ = fVar10 + pMVar5->M[0].tArrive.Fall;
  auVar11._8_4_ = fVar10 + 0.0;
  auVar11._12_4_ = fVar10 + 0.0;
  auVar12._4_4_ = pMVar5->M[0].tArrive.Rise + fVar13;
  auVar12._0_4_ = pCut->M[1].tArrive.Rise + fVar13;
  auVar12._8_4_ = fVar13 + 0.0;
  auVar12._12_4_ = fVar13 + 0.0;
  auVar12 = maxps(auVar11,auVar12);
  fVar10 = auVar12._0_4_;
  fVar13 = auVar12._4_4_;
  if ((iVar4 == 0) && (p->DelayTarget <= 1e+09 && p->DelayTarget != 1e+09)) {
    if (fVar10 + p->fEpsilon < pMVar5->M[0].tArrive.Worst) {
      pNode->pCutBest[0] = (Map_Cut_t *)0x0;
      return;
    }
    if (pCut->M[1].tArrive.Worst <= fVar13 + p->fEpsilon) {
      return;
    }
    pNode->pCutBest[1] = (Map_Cut_t *)0x0;
    return;
  }
  if (pNode->nRefAct[0] == 0) {
    return;
  }
  if (pNode->nRefAct[1] == 0) {
    return;
  }
  if (iVar4 - 3U < 2) {
    uVar8 = -(uint)(fVar10 + p->fEpsilon < pNode->tRequired[0].Worst);
    uVar9 = -(uint)(fVar13 + p->fEpsilon < pNode->tRequired[1].Worst);
  }
  else {
    uVar8 = 0;
    uVar9 = 0;
    if (iVar4 == 2) {
      fVar14 = (pMVar2->tDelayInv).Worst * 3.0;
      uVar8 = -(uint)(p->fEpsilon + fVar14 + fVar10 < pNode->tRequired[0].Worst);
      uVar9 = -(uint)(p->fEpsilon + fVar14 + fVar13 < pNode->tRequired[1].Worst);
    }
  }
  auVar3._8_4_ = 0;
  auVar3._0_8_ = (ulong)uVar8 << 0x3f;
  auVar3._12_4_ = (int)(((ulong)uVar9 << 0x3f) >> 0x20);
  iVar6 = movmskpd((int)pMVar2,auVar3);
  if (iVar6 == 0) {
    return;
  }
  bVar7 = (byte)iVar6;
  if ((bVar7 >> 1 & bVar7) == 1) {
    fVar10 = pCut->M[1].AreaFlow;
    pfVar1 = &pMVar5->M[0].AreaFlow;
    if (fVar10 < *pfVar1 || fVar10 == *pfVar1) {
LAB_003ff701:
      if (0 < pNode->nRefAct[0] && 1 < iVar4) {
        Map_CutDeref(pMVar5,0,p->fUseProfile);
        iVar4 = p->fMappingMode;
      }
      pNode->pCutBest[0] = (Map_Cut_t *)0x0;
      if (iVar4 < 2) {
        return;
      }
      if (pNode->nRefAct[1] != 0) {
        return;
      }
      pMVar5 = pNode->pCutBest[1];
      iVar4 = p->fUseProfile;
      iVar6 = 1;
      goto LAB_003ff758;
    }
  }
  else {
    if (((bVar7 ^ bVar7 >> 1) & 1) == 0) {
      __assert_fail("fUsePhase0 ^ fUsePhase1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperMatch.c"
                    ,0x1ec,"void Map_NodeTryDroppingOnePhase(Map_Man_t *, Map_Node_t *)");
    }
    if (bVar7 >> 1 == 0) goto LAB_003ff701;
  }
  if (0 < pNode->nRefAct[1] && 1 < iVar4) {
    Map_CutDeref(pCut,1,p->fUseProfile);
    iVar4 = p->fMappingMode;
  }
  pNode->pCutBest[1] = (Map_Cut_t *)0x0;
  if ((iVar4 < 2) || (pNode->nRefAct[0] != 0)) {
    return;
  }
  pMVar5 = pNode->pCutBest[0];
  iVar4 = p->fUseProfile;
  iVar6 = 0;
LAB_003ff758:
  Map_CutRef(pMVar5,iVar6,iVar4);
  return;
}

Assistant:

void Map_NodeTryDroppingOnePhase( Map_Man_t * p, Map_Node_t * pNode )
{
    Map_Match_t * pMatchBest0, * pMatchBest1;
    float tWorst0Using1, tWorst1Using0; 
    int fUsePhase1, fUsePhase0;

    // nothing to do if one of the phases is already dropped
    if ( pNode->pCutBest[0] == NULL || pNode->pCutBest[1] == NULL )
        return;

    // do not drop while recovering area flow
    if ( p->fMappingMode == 1 )//|| p->fMappingMode == 2 )
        return;

    // get the pointers to the matches of the best cuts
    pMatchBest0 = pNode->pCutBest[0]->M + 0;
    pMatchBest1 = pNode->pCutBest[1]->M + 1;

    // get the worst arrival times of each phase
    // implemented using the other phase with inverter added
    tWorst0Using1 = Map_TimeMatchWithInverter( p, pMatchBest1 );
    tWorst1Using0 = Map_TimeMatchWithInverter( p, pMatchBest0 );

    // consider the case of mapping for delay
    if ( p->fMappingMode == 0 && p->DelayTarget < ABC_INFINITY )
    { 
        // if the arrival time of a phase is larger than the arrival time 
        // of the opposite phase plus the inverter, drop this phase
        if ( pMatchBest0->tArrive.Worst > tWorst0Using1 + p->fEpsilon ) 
            pNode->pCutBest[0] = NULL;
        else if ( pMatchBest1->tArrive.Worst > tWorst1Using0 + p->fEpsilon ) 
            pNode->pCutBest[1] = NULL;
        return;
    }

    // do not perform replacement if one of the phases is unused
    if ( pNode->nRefAct[0] == 0 || pNode->nRefAct[1] == 0 )
        return;
 
    // check if replacement of each phase is possible using required times
    fUsePhase0 = fUsePhase1 = 0;
    if ( p->fMappingMode == 2 )
    {
        fUsePhase0 = (pNode->tRequired[1].Worst > tWorst1Using0 + 3*p->pSuperLib->tDelayInv.Worst + p->fEpsilon);
        fUsePhase1 = (pNode->tRequired[0].Worst > tWorst0Using1 + 3*p->pSuperLib->tDelayInv.Worst + p->fEpsilon);
    }
    else if ( p->fMappingMode == 3 || p->fMappingMode == 4 )
    {
        fUsePhase0 = (pNode->tRequired[1].Worst > tWorst1Using0 + p->fEpsilon);
        fUsePhase1 = (pNode->tRequired[0].Worst > tWorst0Using1 + p->fEpsilon);
    }
    if ( !fUsePhase0 && !fUsePhase1 )
        return;

    // if replacement is possible both ways, use the one that works better
    if ( fUsePhase0 && fUsePhase1 )
    {
        if ( pMatchBest0->AreaFlow < pMatchBest1->AreaFlow )
            fUsePhase1 = 0;
        else
            fUsePhase0 = 0;
    }
    // only one phase should be used
    assert( fUsePhase0 ^ fUsePhase1 );

    // set the corresponding cut to NULL
    if ( fUsePhase0 )
    {
        // deref phase 1 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[1] > 0 )
            Map_CutDeref( pNode->pCutBest[1], 1, p->fUseProfile );
        // get rid of the cut
        pNode->pCutBest[1] = NULL;
        // ref phase 0 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[0] == 0 )
            Map_CutRef( pNode->pCutBest[0], 0, p->fUseProfile );
    }
    else
    {
        // deref phase 0 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[0] > 0 )
            Map_CutDeref( pNode->pCutBest[0], 0, p->fUseProfile );
        // get rid of the cut
        pNode->pCutBest[0] = NULL;
        // ref phase 1 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[1] == 0 )
            Map_CutRef( pNode->pCutBest[1], 1, p->fUseProfile );
    }
}